

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_memory_barrier2
          (Impl *this,Value *state,VkMemoryBarrier2KHR **out_info)

{
  VkMemoryBarrier2 *pVVar1;
  Type pGVar2;
  uint64_t uVar3;
  
  pVVar1 = ScratchAllocator::allocate_cleared<VkMemoryBarrier2>(&this->allocator);
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"srcStageMask");
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint64(pGVar2);
  pVVar1->srcStageMask = uVar3;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"srcAccessMask");
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint64(pGVar2);
  pVVar1->srcAccessMask = uVar3;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"dstStageMask");
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint64(pGVar2);
  pVVar1->dstStageMask = uVar3;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"dstAccessMask");
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint64(pGVar2);
  pVVar1->dstAccessMask = uVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_memory_barrier2(const Value &state,
                                                VkMemoryBarrier2KHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkMemoryBarrier2KHR>();
	*out_info = info;

	info->srcStageMask = static_cast<VkPipelineStageFlags2KHR>(state["srcStageMask"].GetUint64());
	info->srcAccessMask = static_cast<VkAccessFlags2KHR>(state["srcAccessMask"].GetUint64());
	info->dstStageMask = static_cast<VkPipelineStageFlags2KHR>(state["dstStageMask"].GetUint64());
	info->dstAccessMask = static_cast<VkAccessFlags2KHR>(state["dstAccessMask"].GetUint64());

	return true;
}